

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstream.c
# Opt level: O0

err_t MemWrite(memstream *p,void *Data,size_t Size,size_t *Written)

{
  size_t *Written_local;
  size_t Size_local;
  void *Data_local;
  memstream *p_local;
  
  *Written = 0;
  if (p->Size < Size + p->Pos) {
    p_local = (memstream *)0xfffffffffffffffc;
  }
  else {
    if (p->Ptr == (uint8_t *)0x0) {
      __assert_fail("p->Ptr!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/file/memstream.c"
                    ,0x30,"err_t MemWrite(memstream *, const void *, size_t, size_t *)");
    }
    memcpy(p->Ptr + p->Pos,Data,Size);
    p->Pos = Size + p->Pos;
    *Written = Size;
    p_local = (memstream *)0x0;
  }
  return (err_t)p_local;
}

Assistant:

static err_t MemWrite(memstream* p, const void* Data, size_t Size, size_t* Written)
{
    *Written = 0;
    if (Size + p->Pos > p->Size)
        return ERR_INVALID_PARAM;
    assert(p->Ptr!=NULL);
    memcpy((uint8_t*)p->Ptr + p->Pos, Data, Size);
    p->Pos += Size;
    *Written = Size;
    return ERR_NONE;
}